

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.cc
# Opt level: O3

void __thiscall vw::learn(vw *this,example *ec)

{
  single_learner *psVar1;
  vw_exception *this_00;
  long lVar2;
  stringstream __msg;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190;
  
  if (this->l[0xe8] != (learner<char,_char>)0x1) {
    lVar2 = 0x30;
    if (ec->test_only == false) {
      lVar2 = (ulong)((byte)~this->training & 1) * 8 + 0x28;
    }
    psVar1 = LEARNER::as_singleline<char,char>(this->l);
    (**(code **)(psVar1 + lVar2))
              (*(undefined8 *)(psVar1 + 0x18),*(undefined8 *)(psVar1 + 0x20),ec,
               *(code **)(psVar1 + lVar2));
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (&local_190,"This reduction does not support single-line examples.",0x35);
  this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/global_data.cc"
             ,0x90,&local_1c0);
  __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

void vw::learn(example& ec)
{
  if (l->is_multiline)
    THROW("This reduction does not support single-line examples.");

  if (ec.test_only || !training)
    LEARNER::as_singleline(l)->predict(ec);
  else
    LEARNER::as_singleline(l)->learn(ec);
}